

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topology.cpp
# Opt level: O2

void lume::FillGrobToIndexMap(GrobHashMap<GrobIndex> *indexMapInOut,Mesh *mesh,GrobSet grobSet)

{
  int iVar1;
  grob_t grobType;
  _Tuple_impl<0UL,_lume::GrobArray_*,_std::default_delete<lume::GrobArray>_> this;
  bool bVar2;
  index_t iVar3;
  int iVar4;
  int iVar5;
  iterator __begin2;
  iterator __end2;
  GrobSet local_9c;
  Mesh *local_98;
  iterator local_90;
  index_t *local_70;
  uint64_t local_68;
  uint local_60;
  undefined8 local_58;
  iterator local_50;
  
  local_9c.m_offset = grobSet.m_offset;
  local_98 = mesh;
  iVar3 = Mesh::num(mesh,&local_9c);
  std::__detail::
  _Rehash_base<lume::Grob,_std::pair<const_lume::Grob,_lume::GrobIndex>,_std::allocator<std::pair<const_lume::Grob,_lume::GrobIndex>_>,_std::__detail::_Select1st,_std::equal_to<lume::Grob>,_std::hash<lume::Grob>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
  ::reserve((_Rehash_base<lume::Grob,_std::pair<const_lume::Grob,_lume::GrobIndex>,_std::allocator<std::pair<const_lume::Grob,_lume::GrobIndex>_>,_std::__detail::_Select1st,_std::equal_to<lume::Grob>,_std::hash<lume::Grob>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
             *)indexMapInOut,(ulong)iVar3);
  iVar1 = *(int *)(impl::GROB_SET_DESCS + (ulong)(local_9c.m_offset + 2) * 4);
  for (iVar5 = 0; iVar5 != iVar1; iVar5 = iVar5 + 1) {
    grobType = *(grob_t *)(impl::GROB_SET_DESCS + (ulong)(local_9c.m_offset + iVar5 + 3) * 4);
    bVar2 = Mesh::has(local_98,grobType);
    if (bVar2) {
      this.super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl =
           local_98->m_grobArrays[grobType]._M_t.
           super___uniq_ptr_impl<lume::GrobArray,_std::default_delete<lume::GrobArray>_>._M_t.
           super__Tuple_impl<0UL,_lume::GrobArray_*,_std::default_delete<lume::GrobArray>_>.
           super__Head_base<0UL,_lume::GrobArray_*,_false>;
      GrobArray::begin(&local_90,
                       (GrobArray *)
                       this.super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl);
      GrobArray::end(&local_50,
                     (GrobArray *)this.super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl)
      ;
      iVar4 = 0;
      while ((local_90.m_grob.m_globCornerInds != local_50.m_grob.m_globCornerInds ||
             (*(int *)(impl::GROB_DESCS + (ulong)local_90.m_grob.m_desc.m_offset * 4) !=
              *(int *)(impl::GROB_DESCS + (ulong)local_50.m_grob.m_desc.m_offset * 4)))) {
        local_68 = local_90.m_grob.m_cornerOffsets.m_data;
        local_60 = local_90.m_grob.m_desc.m_offset;
        local_58 = CONCAT44(iVar4,grobType);
        local_70 = local_90.m_grob.m_globCornerInds;
        std::
        _Hashtable<lume::Grob,std::pair<lume::Grob_const,lume::GrobIndex>,std::allocator<std::pair<lume::Grob_const,lume::GrobIndex>>,std::__detail::_Select1st,std::equal_to<lume::Grob>,std::hash<lume::Grob>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<lume::Grob,lume::GrobIndex>>
                  ((_Hashtable<lume::Grob,std::pair<lume::Grob_const,lume::GrobIndex>,std::allocator<std::pair<lume::Grob_const,lume::GrobIndex>>,std::__detail::_Select1st,std::equal_to<lume::Grob>,std::hash<lume::Grob>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)indexMapInOut,&local_70);
        local_90.m_grob.m_globCornerInds = local_90.m_grob.m_globCornerInds + local_90.m_numCorners;
        iVar4 = iVar4 + 1;
      }
    }
  }
  return;
}

Assistant:

void FillGrobToIndexMap (GrobHashMap <GrobIndex>& indexMapInOut,
                       const Mesh& mesh,
                       const GrobSet grobSet)
{
	indexMapInOut.reserve (mesh.num (grobSet));
	
	for (auto grobType : grobSet) {
		if (!mesh.has (grobType))
			continue;
		
		index_t counter = 0;

		for(auto grob : mesh.grobs (grobType)) {
			indexMapInOut.insert (make_pair (grob, GrobIndex (grobType, counter++)));
		}
	}
}